

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void tooltip_cb(Fl_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Fl_Widget_Type *local_28;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Input *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar2 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      pcVar3 = Fl_Widget_Type::tooltip(current_widget);
      Fl_Input_::static_value(&i->super_Fl_Input_,pcVar3);
    }
  }
  else {
    bVar1 = false;
    for (local_28 = (Fl_Widget_Type *)Fl_Type::first; local_28 != (Fl_Widget_Type *)0x0;
        local_28 = (Fl_Widget_Type *)(local_28->super_Fl_Type).next) {
      if (((local_28->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(local_28->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        pcVar3 = Fl_Input_::value(&i->super_Fl_Input_);
        Fl_Widget_Type::tooltip(local_28,pcVar3);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void tooltip_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_widget()) {
      i->activate();
      i->static_value(((Fl_Widget_Type*)current_widget)->tooltip());
    } else i->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        ((Fl_Widget_Type*)o)->tooltip(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}